

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextVkImpl::DisposeCurrentCmdBuffer
          (DeviceContextVkImpl *this,SoftwareQueueIndex CmdQueue,Uint64 FenceValue)

{
  VkCommandBuffer vkCmdBuff;
  pointer pVVar1;
  string msg;
  string local_48;
  
  if (((this->m_CommandBuffer).m_State.RenderPass != (VkRenderPass)0x0) ||
     ((this->m_CommandBuffer).m_State.DynamicRenderingHash != 0)) {
    FormatString<char[53]>
              (&local_48,(char (*) [53])"Disposing command buffer with unfinished render pass");
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"DisposeCurrentCmdBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x109);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  vkCmdBuff = (this->m_CommandBuffer).m_VkCmdBuffer;
  if (vkCmdBuff != (VkCommandBuffer)0x0) {
    DisposeVkCmdBuffer(this,CmdQueue,vkCmdBuff,FenceValue);
    (this->m_CommandBuffer).m_State.IndexBuffer = (VkBuffer)0x0;
    (this->m_CommandBuffer).m_State.IndexBufferOffset = 0;
    (this->m_CommandBuffer).m_State.ComputePipeline = (VkPipeline)0x0;
    (this->m_CommandBuffer).m_State.RayTracingPipeline = (VkPipeline)0x0;
    (this->m_CommandBuffer).m_State.Framebuffer = (VkFramebuffer)0x0;
    (this->m_CommandBuffer).m_State.GraphicsPipeline = (VkPipeline)0x0;
    (this->m_CommandBuffer).m_VkCmdBuffer = (VkCommandBuffer)0x0;
    (this->m_CommandBuffer).m_State.RenderPass = (VkRenderPass)0x0;
    (this->m_CommandBuffer).m_State.IndexType = VK_INDEX_TYPE_MAX_ENUM;
    (this->m_CommandBuffer).m_State.FramebufferWidth = 0;
    (this->m_CommandBuffer).m_State.FramebufferHeight = 0;
    (this->m_CommandBuffer).m_State.InsidePassQueries = 0;
    (this->m_CommandBuffer).m_State.OutsidePassQueries = 0;
    (this->m_CommandBuffer).m_Barrier.MemorySrcAccess = 0;
    (this->m_CommandBuffer).m_Barrier.MemoryDstAccess = 0;
    (this->m_CommandBuffer).m_Barrier.ImageSrcStages = 0;
    (this->m_CommandBuffer).m_Barrier.ImageDstStages = 0;
    (this->m_CommandBuffer).m_State.DynamicRenderingHash = 0;
    (this->m_CommandBuffer).m_Barrier.MemorySrcStages = 0;
    (this->m_CommandBuffer).m_Barrier.MemoryDstStages = 0;
    (this->m_CommandBuffer).m_Barrier.SupportedStagesMask = 0xffffffff;
    (this->m_CommandBuffer).m_Barrier.SupportedAccessMask = 0xffffffff;
    pVVar1 = (this->m_CommandBuffer).m_ImageBarriers.
             super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((this->m_CommandBuffer).m_ImageBarriers.
        super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
        super__Vector_impl_data._M_finish != pVVar1) {
      (this->m_CommandBuffer).m_ImageBarriers.
      super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
      super__Vector_impl_data._M_finish = pVVar1;
    }
  }
  return;
}

Assistant:

inline void DeviceContextVkImpl::DisposeCurrentCmdBuffer(SoftwareQueueIndex CmdQueue, Uint64 FenceValue)
{
    VERIFY(!m_CommandBuffer.IsInRenderScope(), "Disposing command buffer with unfinished render pass");
    VkCommandBuffer vkCmdBuff = m_CommandBuffer.GetVkCmdBuffer();
    if (vkCmdBuff != VK_NULL_HANDLE)
    {
        DisposeVkCmdBuffer(CmdQueue, vkCmdBuff, FenceValue);
        m_CommandBuffer.Reset();
    }
}